

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall CommandDrawBar::ParseComparator(CommandDrawBar *this,FScanner *sc)

{
  bool bVar1;
  bool bVar2;
  PClassActor *pPVar3;
  
  bVar1 = FScanner::CheckToken(sc,0x28);
  bVar2 = FScanner::CheckToken(sc,0x101);
  if (!bVar2) {
    if (!bVar1) {
      return;
    }
    bVar2 = FScanner::CheckToken(sc,0x102);
    if (!bVar2) {
      if (!bVar1) {
        return;
      }
      bVar2 = FScanner::CheckToken(sc,0x104);
      if (bVar2) {
        (this->data).useMaximumConstant = true;
        (this->data).field_1.value = sc->Number;
      }
      goto LAB_005ff28e;
    }
  }
  pPVar3 = PClass::FindActor(sc->String);
  (this->data).field_1.inventoryItem = pPVar3;
  if (pPVar3 != (PClassActor *)0x0) {
    if (pPVar3 == (PClassActor *)AInventory::RegistrationInfo.MyClass) goto LAB_005ff28e;
    do {
      pPVar3 = (PClassActor *)(pPVar3->super_PClass).ParentClass;
      if (pPVar3 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
    } while (pPVar3 != (PClassActor *)0x0);
    if (pPVar3 != (PClassActor *)0x0) goto LAB_005ff28e;
  }
  FScanner::ScriptMessage(sc,"\'%s\' is not a type of inventory item.",sc->String);
  (this->data).field_1.inventoryItem = (PClassActor *)AInventory::RegistrationInfo.MyClass;
LAB_005ff28e:
  if (!bVar1) {
    return;
  }
  FScanner::MustGetToken(sc,0x29);
  return;
}

Assistant:

void	ParseComparator(FScanner &sc)
		{
			bool extendedSyntax = sc.CheckToken('(');

			if(sc.CheckToken(TK_Identifier) || (extendedSyntax && sc.CheckToken(TK_StringConst))) //comparing reference
			{
				data.inventoryItem = PClass::FindActor(sc.String);
				if(data.inventoryItem == NULL || !RUNTIME_CLASS(AInventory)->IsAncestorOf(data.inventoryItem)) //must be a kind of inventory
				{
					sc.ScriptMessage("'%s' is not a type of inventory item.", sc.String);
					data.inventoryItem = RUNTIME_CLASS(AInventory);
				}
			}
			else if(extendedSyntax && sc.CheckToken(TK_IntConst))
			{
				data.useMaximumConstant = true;
				data.value = sc.Number;
			}

			if(extendedSyntax)
				sc.MustGetToken(')');
		}